

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

void spirv_cross::inner::join_helper<char,std::__cxx11::string&,char>
               (StringStream<4096UL,_4096UL> *stream,char *t,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char *ts_1)

{
  char local_1a;
  char local_19;
  
  local_1a = *t;
  StringStream<4096UL,_4096UL>::append(stream,&local_1a,1);
  StringStream<4096UL,_4096UL>::append(stream,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  local_19 = *ts_1;
  StringStream<4096UL,_4096UL>::append(stream,&local_19,1);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}